

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O3

bool __thiscall
phmap::priv::
raw_hash_set<phmap::priv::NodeHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::has_element(raw_hash_set<phmap::priv::NodeHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *this,value_type *elem,size_t hashval)

{
  char *pcVar1;
  ctrl_t *pcVar2;
  ulong uVar3;
  slot_type *pptVar4;
  pointer __s2;
  size_t __n;
  uint uVar5;
  ushort uVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  int iVar23;
  uint uVar24;
  ulong uVar25;
  ulong uVar26;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  __m128i match;
  char cVar27;
  char cVar31;
  char cVar32;
  char cVar33;
  
  pcVar2 = this->ctrl_;
  if (pcVar2 != (ctrl_t *)0x0) {
    uVar3 = this->capacity_;
    if ((uVar3 + 1 & uVar3) != 0) {
      __assert_fail("((mask + 1) & mask) == 0 && \"not a mask\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                    ,0x95,"phmap::priv::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]");
    }
    uVar25 = hashval >> 7;
    auVar28 = ZEXT216(CONCAT11((char)hashval,(char)hashval) & 0x7f7f);
    auVar28 = pshuflw(auVar28,auVar28,0);
    pptVar4 = this->slots_;
    __s2 = (elem->_M_dataplus)._M_p;
    __n = elem->_M_string_length;
    uVar26 = 0;
    while( true ) {
      uVar25 = uVar25 & uVar3;
      pcVar1 = pcVar2 + uVar25;
      cVar7 = *pcVar1;
      cVar8 = pcVar1[1];
      cVar9 = pcVar1[2];
      cVar10 = pcVar1[3];
      cVar11 = pcVar1[4];
      cVar12 = pcVar1[5];
      cVar13 = pcVar1[6];
      cVar14 = pcVar1[7];
      cVar15 = pcVar1[8];
      cVar16 = pcVar1[9];
      cVar17 = pcVar1[10];
      cVar18 = pcVar1[0xb];
      cVar19 = pcVar1[0xc];
      cVar20 = pcVar1[0xd];
      cVar21 = pcVar1[0xe];
      cVar22 = pcVar1[0xf];
      cVar27 = auVar28[0];
      auVar29[0] = -(cVar27 == cVar7);
      cVar31 = auVar28[1];
      auVar29[1] = -(cVar31 == cVar8);
      cVar32 = auVar28[2];
      auVar29[2] = -(cVar32 == cVar9);
      cVar33 = auVar28[3];
      auVar29[3] = -(cVar33 == cVar10);
      auVar29[4] = -(cVar27 == cVar11);
      auVar29[5] = -(cVar31 == cVar12);
      auVar29[6] = -(cVar32 == cVar13);
      auVar29[7] = -(cVar33 == cVar14);
      auVar29[8] = -(cVar27 == cVar15);
      auVar29[9] = -(cVar31 == cVar16);
      auVar29[10] = -(cVar32 == cVar17);
      auVar29[0xb] = -(cVar33 == cVar18);
      auVar29[0xc] = -(cVar27 == cVar19);
      auVar29[0xd] = -(cVar31 == cVar20);
      auVar29[0xe] = -(cVar32 == cVar21);
      auVar29[0xf] = -(cVar33 == cVar22);
      uVar6 = (ushort)(SUB161(auVar29 >> 7,0) & 1) | (ushort)(SUB161(auVar29 >> 0xf,0) & 1) << 1 |
              (ushort)(SUB161(auVar29 >> 0x17,0) & 1) << 2 |
              (ushort)(SUB161(auVar29 >> 0x1f,0) & 1) << 3 |
              (ushort)(SUB161(auVar29 >> 0x27,0) & 1) << 4 |
              (ushort)(SUB161(auVar29 >> 0x2f,0) & 1) << 5 |
              (ushort)(SUB161(auVar29 >> 0x37,0) & 1) << 6 |
              (ushort)(SUB161(auVar29 >> 0x3f,0) & 1) << 7 |
              (ushort)(SUB161(auVar29 >> 0x47,0) & 1) << 8 |
              (ushort)(SUB161(auVar29 >> 0x4f,0) & 1) << 9 |
              (ushort)(SUB161(auVar29 >> 0x57,0) & 1) << 10 |
              (ushort)(SUB161(auVar29 >> 0x5f,0) & 1) << 0xb |
              (ushort)(SUB161(auVar29 >> 0x67,0) & 1) << 0xc |
              (ushort)(SUB161(auVar29 >> 0x6f,0) & 1) << 0xd |
              (ushort)(SUB161(auVar29 >> 0x77,0) & 1) << 0xe | (ushort)(auVar29[0xf] >> 7) << 0xf;
      if (uVar6 != 0) {
        uVar24 = (uint)uVar6;
        do {
          uVar5 = 0;
          if (uVar24 != 0) {
            for (; (uVar24 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
            }
          }
          if (pptVar4[uVar5 + uVar25 & uVar3]->_M_string_length == __n) {
            if (__n == 0) {
              return true;
            }
            iVar23 = bcmp((pptVar4[uVar5 + uVar25 & uVar3]->_M_dataplus)._M_p,__s2,__n);
            if (iVar23 == 0) {
              return true;
            }
          }
          uVar24 = uVar24 - 1 & uVar24;
        } while (uVar24 != 0);
      }
      auVar30[0] = -(cVar7 == -0x80);
      auVar30[1] = -(cVar8 == -0x80);
      auVar30[2] = -(cVar9 == -0x80);
      auVar30[3] = -(cVar10 == -0x80);
      auVar30[4] = -(cVar11 == -0x80);
      auVar30[5] = -(cVar12 == -0x80);
      auVar30[6] = -(cVar13 == -0x80);
      auVar30[7] = -(cVar14 == -0x80);
      auVar30[8] = -(cVar15 == -0x80);
      auVar30[9] = -(cVar16 == -0x80);
      auVar30[10] = -(cVar17 == -0x80);
      auVar30[0xb] = -(cVar18 == -0x80);
      auVar30[0xc] = -(cVar19 == -0x80);
      auVar30[0xd] = -(cVar20 == -0x80);
      auVar30[0xe] = -(cVar21 == -0x80);
      auVar30[0xf] = -(cVar22 == -0x80);
      if ((((((((((((((((auVar30 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                       (auVar30 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar30 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar30 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar30 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar30 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar30 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar30 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar30 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar30 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar30 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar30 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar30 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar30 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar30 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || cVar22 == -0x80)
      break;
      uVar25 = uVar25 + uVar26 + 0x10;
      uVar26 = uVar26 + 0x10;
      if (uVar3 <= uVar26) {
        __assert_fail("seq.getindex() < capacity_ && \"full table!\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                      ,0x87c,
                      "bool phmap::priv::raw_hash_set<phmap::priv::NodeHashSetPolicy<std::basic_string<char>>, phmap::priv::StatefulTestingHash, phmap::priv::StatefulTestingEqual, phmap::priv::Alloc<std::basic_string<char>>>::has_element(const value_type &__restrict, size_t) const [Policy = phmap::priv::NodeHashSetPolicy<std::basic_string<char>>, Hash = phmap::priv::StatefulTestingHash, Eq = phmap::priv::StatefulTestingEqual, Alloc = phmap::priv::Alloc<std::basic_string<char>>]"
                     );
      }
    }
  }
  return false;
}

Assistant:

bool has_element(const value_type& PHMAP_RESTRICT elem, size_t hashval) const {
        PHMAP_IF_CONSTEXPR (!std_alloc_t::value) {
            // ctrl_ could be nullptr
            if (!ctrl_)
                return false;
        }
        auto seq = probe(hashval);
        while (true) {
            Group g{ctrl_ + seq.offset()};
            for (uint32_t i : g.Match((h2_t)H2(hashval))) {
                if (PHMAP_PREDICT_TRUE(PolicyTraits::element(slots_ + seq.offset((size_t)i)) ==
                                      elem))
                    return true;
            }
            if (PHMAP_PREDICT_TRUE(g.MatchEmpty())) return false;
            seq.next();
            assert(seq.getindex() < capacity_ && "full table!");
        }
        return false;
    }